

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainControl.cpp
# Opt level: O2

void __thiscall MainControl::start(MainControl *this)

{
  bool bVar1;
  int iVar2;
  Scene scene;
  Scene SStack_58;
  
  Scene::Scene(&SStack_58,0,0);
  do {
    Scene::update(&SStack_58);
    Scene::draw(&SStack_58);
    iVar2 = kbhit();
    if (iVar2 != 0) {
      iVar2 = readch();
      switch(iVar2) {
      case 0x61:
        Scene::groundSceneSelectLeft(&SStack_58);
        break;
      case 0x62:
      case 99:
switchD_0010ba8b_caseD_72:
        bVar1 = Scene::isStopOrOver(&SStack_58);
        if (iVar2 == 0x1b && bVar1) {
          screenClear();
          std::operator<<((ostream *)&std::cout,"\x1b[0;0H");
          Scene::~Scene(&SStack_58);
          return;
        }
        if (iVar2 == 10) {
          Scene::process(&SStack_58);
        }
        break;
      case 100:
        Scene::groundSceneSelectRight(&SStack_58);
        break;
      case 0x65:
        Scene::stateSceneSelectRight(&SStack_58);
        break;
      case 0x66:
        Scene::changeState(&SStack_58);
        break;
      default:
        switch(iVar2) {
        case 0x70:
          Scene::stopOrContinue(&SStack_58);
          break;
        case 0x71:
          Scene::stateSceneSelectLeft(&SStack_58);
          break;
        default:
          goto switchD_0010ba8b_caseD_72;
        case 0x73:
          Scene::groundSceneSelectDown(&SStack_58);
          break;
        case 0x77:
          Scene::groundSceneSelectUp(&SStack_58);
        }
      }
    }
    usleep(this->breakTime * 1000);
  } while( true );
}

Assistant:

void MainControl::start(){
	Scene scene(0, 0);
    while(1){
		scene.update();
		scene.draw();
		if(kbhit()){
			int key = readch();
			/* std::cout << key << std::endl; */
			if(key == 'a'){
				/* std::cout << "left" << std::endl; */
				scene.groundSceneSelectLeft();
			}
			else if(key == 'd'){
				scene.groundSceneSelectRight();
			}
			else if(key == 'w'){
				scene.groundSceneSelectUp();
			}
			else if(key == 's'){
				scene.groundSceneSelectDown();
			}
			else if(key == 'q'){
				scene.stateSceneSelectLeft();
			}
			else if(key == 'e'){
				scene.stateSceneSelectRight();
			}
			else if(key == 'f'){
				scene.changeState();
			}
			else if(key == 'p'){
				scene.stopOrContinue();
			}
			else if(scene.isStopOrOver() && key == 27){
				break;
			}
			else if(key == 10){
				/* std::cout << "enter" << std::endl; */
				scene.process();
			}
        }
        usleep(breakTime*1000);
    }
    screenClear();
    cout << "\033[0;0H";
}